

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_create_objects_tree.cpp
# Opt level: O1

int main(void)

{
  i injector;
  injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>
  local_1;
  
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>
  ::
  create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,true>,app,boost::ext::di::v1_3_0::no_name>
            (&local_1);
  return 0;
}

Assistant:

int main() {
  /**
   * renderer renderer_;
   * view view_{"", renderer_};
   * model model_;
   * controller controller_{model_, view_};
   * user user_;
   * app app_{controller_, user_};
   */

  auto injector = di::make_injector();
  injector.create<app>();
}